

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

ssize_t nghttp2_hd_inflate_hd_nv
                  (nghttp2_hd_inflater *inflater,nghttp2_hd_nv *nv_out,int *inflate_flags,
                  uint8_t *in,size_t inlen,int in_final)

{
  nghttp2_mem *mem_00;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint8_t *last_00;
  size_t in_00;
  nghttp2_hd_nv *inflater_00;
  int iVar6;
  size_t maxlen;
  nghttp2_rcbuf *local_a0;
  size_t local_70;
  size_t prefixlen;
  nghttp2_mem *mem;
  int busy;
  int rfin;
  uint8_t *last;
  uint8_t *first;
  ssize_t rv;
  size_t sStack_38;
  int in_final_local;
  size_t inlen_local;
  uint8_t *in_local;
  int *inflate_flags_local;
  nghttp2_hd_nv *nv_out_local;
  nghttp2_hd_inflater *inflater_local;
  
  first = (uint8_t *)0x0;
  _busy = in + inlen;
  mem._4_4_ = 0;
  mem._0_4_ = 0;
  mem_00 = (inflater->ctx).mem;
  if ((inflater->ctx).bad != '\0') {
    return -0x20b;
  }
  last = in;
  rv._4_4_ = in_final;
  sStack_38 = inlen;
  inlen_local = (size_t)in;
  in_local = (uint8_t *)inflate_flags;
  inflate_flags_local = (int *)nv_out;
  nv_out_local = (nghttp2_hd_nv *)inflater;
  hd_inflate_keep_free(inflater);
  in_local[0] = '\0';
  in_local[1] = '\0';
  in_local[2] = '\0';
  in_local[3] = '\0';
  do {
    inflater_00 = nv_out_local;
    in_00 = inlen_local;
    last_00 = _busy;
    if ((uint8_t *)inlen_local == _busy && (int)mem == 0) {
      if ((uint8_t *)inlen_local != _busy) {
        __assert_fail("in == last",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_hd.c"
                      ,0x89b,
                      "ssize_t nghttp2_hd_inflate_hd_nv(nghttp2_hd_inflater *, nghttp2_hd_nv *, int *, const uint8_t *, size_t, int)"
                     );
      }
      if (rv._4_4_ != 0) {
        if ((*(int *)((long)&nv_out_local[9].value + 4) != 2) &&
           (*(int *)((long)&nv_out_local[9].value + 4) != 1)) {
          first = (uint8_t *)0xfffffffffffffdf5;
          goto LAB_00c4ecaa;
        }
        *(uint *)in_local = *(uint *)in_local | 1;
      }
      return inlen_local - (long)last;
    }
    mem._0_4_ = 0;
    switch(*(undefined4 *)((long)&nv_out_local[9].value + 4)) {
    case 0:
      if ((*(byte *)inlen_local & 0xe0) != 0x20) {
        first = (uint8_t *)0xfffffffffffffdf5;
        goto LAB_00c4ecaa;
      }
    case 1:
    case 2:
      if ((*(byte *)inlen_local & 0xe0) == 0x20) {
        if (*(int *)((long)&nv_out_local[9].value + 4) == 2) {
          first = (uint8_t *)0xfffffffffffffdf5;
          goto LAB_00c4ecaa;
        }
        *(undefined4 *)&nv_out_local[9].value = 1;
        *(undefined4 *)((long)&nv_out_local[9].value + 4) = 3;
      }
      else if ((*(byte *)inlen_local & 0x80) == 0) {
        if (((*(char *)inlen_local == '@') || (*(char *)inlen_local == '\0')) ||
           (*(char *)inlen_local == '\x10')) {
          *(undefined4 *)&nv_out_local[9].value = 2;
          *(undefined4 *)((long)&nv_out_local[9].value + 4) = 5;
        }
        else {
          *(undefined4 *)&nv_out_local[9].value = 3;
          *(undefined4 *)((long)&nv_out_local[9].value + 4) = 4;
        }
        *(bool *)((long)&nv_out_local[9].token + 1) = (*(byte *)inlen_local & 0x40) != 0;
        *(bool *)((long)&nv_out_local[9].token + 2) = (*(byte *)inlen_local & 0xf0) == 0x10;
        if (*(int *)&nv_out_local[9].value == 2) {
          inlen_local = inlen_local + 1;
        }
      }
      else {
        *(undefined4 *)&nv_out_local[9].value = 1;
        *(undefined4 *)((long)&nv_out_local[9].value + 4) = 4;
      }
      nv_out_local[7].token = 0;
      nv_out_local[7].flags = '\0';
      *(undefined3 *)&nv_out_local[7].field_0x15 = 0;
      nv_out_local[9].name = (nghttp2_rcbuf *)0x0;
      break;
    case 3:
      mem._4_4_ = 0;
      if (*(nghttp2_rcbuf **)&nv_out_local[8].token < nv_out_local[8].value) {
        local_a0 = *(nghttp2_rcbuf **)&nv_out_local[8].token;
      }
      else {
        local_a0 = nv_out_local[8].value;
      }
      first = (uint8_t *)
              hd_inflate_read_len((nghttp2_hd_inflater *)nv_out_local,(int *)((long)&mem + 4),
                                  (uint8_t *)inlen_local,_busy,5,(size_t)local_a0);
      if ((long)first < 0) goto LAB_00c4ecaa;
      inlen_local = (size_t)(first + inlen_local);
      if (mem._4_4_ == 0) goto LAB_00c4ec85;
      nv_out_local[8].token = -1;
      nv_out_local[8].flags = '\0';
      *(undefined3 *)&nv_out_local[8].field_0x15 = 0;
      nv_out_local[2].name = *(nghttp2_rcbuf **)&nv_out_local[7].token;
      hd_context_shrink_table_size((nghttp2_hd_context *)nv_out_local,(nghttp2_hd_map *)0x0);
      *(undefined4 *)((long)&nv_out_local[9].value + 4) = 1;
      break;
    case 4:
      if (*(int *)&nv_out_local[9].value == 1) {
        local_70 = 7;
      }
      else if (*(char *)((long)&nv_out_local[9].token + 1) == '\0') {
        local_70 = 4;
      }
      else {
        local_70 = 6;
      }
      mem._4_4_ = 0;
      maxlen = get_max_index((nghttp2_hd_context *)nv_out_local);
      first = (uint8_t *)
              hd_inflate_read_len((nghttp2_hd_inflater *)inflater_00,(int *)((long)&mem + 4),
                                  (uint8_t *)in_00,last_00,local_70,maxlen);
      if ((long)first < 0) goto LAB_00c4ecaa;
      inlen_local = (size_t)(first + inlen_local);
      if (mem._4_4_ == 0) goto LAB_00c4ec85;
      lVar1._0_4_ = nv_out_local[7].token;
      lVar1._4_1_ = nv_out_local[7].flags;
      lVar1._5_3_ = *(undefined3 *)&nv_out_local[7].field_0x15;
      if (lVar1 == 0) {
        first = (uint8_t *)0xfffffffffffffdf5;
        goto LAB_00c4ecaa;
      }
      if (*(int *)&nv_out_local[9].value == 1) {
        nv_out_local[8].name = *(nghttp2_rcbuf **)&nv_out_local[7].token;
        nv_out_local[8].name = (nghttp2_rcbuf *)&nv_out_local[8].name[-1].field_0x27;
        hd_inflate_commit_indexed
                  ((nghttp2_hd_inflater *)nv_out_local,(nghttp2_hd_nv *)inflate_flags_local);
        *(undefined4 *)((long)&nv_out_local[9].value + 4) = 2;
        *(uint *)in_local = *(uint *)in_local | 2;
        return inlen_local - (long)last;
      }
      nv_out_local[8].name = *(nghttp2_rcbuf **)&nv_out_local[7].token;
      nv_out_local[8].name = (nghttp2_rcbuf *)&nv_out_local[8].name[-1].field_0x27;
      *(undefined4 *)((long)&nv_out_local[9].value + 4) = 9;
      break;
    case 5:
      hd_inflate_set_huffman_encoded((nghttp2_hd_inflater *)nv_out_local,(uint8_t *)inlen_local);
      *(undefined4 *)((long)&nv_out_local[9].value + 4) = 6;
      nv_out_local[7].token = 0;
      nv_out_local[7].flags = '\0';
      *(undefined3 *)&nv_out_local[7].field_0x15 = 0;
      nv_out_local[9].name = (nghttp2_rcbuf *)0x0;
    case 6:
      mem._4_4_ = 0;
      first = (uint8_t *)
              hd_inflate_read_len((nghttp2_hd_inflater *)nv_out_local,(int *)((long)&mem + 4),
                                  (uint8_t *)inlen_local,_busy,7,0x10000);
      if ((long)first < 0) goto LAB_00c4ecaa;
      inlen_local = (size_t)(first + inlen_local);
      if (mem._4_4_ == 0) goto LAB_00c4ec85;
      if ((char)nv_out_local[9].token == '\0') {
        *(undefined4 *)((long)&nv_out_local[9].value + 4) = 8;
        iVar6 = nghttp2_rcbuf_new(&nv_out_local[6].value,*(long *)&nv_out_local[7].token + 1,mem_00)
        ;
      }
      else {
        nghttp2_hd_huff_decode_context_init
                  ((nghttp2_hd_huff_decode_context *)&nv_out_local[2].token);
        *(undefined4 *)((long)&nv_out_local[9].value + 4) = 7;
        iVar6 = nghttp2_rcbuf_new(&nv_out_local[6].value,*(long *)&nv_out_local[7].token * 2 + 1,
                                  mem_00);
      }
      first = (uint8_t *)(long)iVar6;
      if (first != (uint8_t *)0x0) goto LAB_00c4ecaa;
      nghttp2_buf_wrap_init
                ((nghttp2_buf *)(nv_out_local + 3),(nv_out_local[6].value)->base,
                 (nv_out_local[6].value)->len);
      break;
    case 7:
      first = (uint8_t *)
              hd_inflate_read_huff
                        ((nghttp2_hd_inflater *)nv_out_local,(nghttp2_buf *)(nv_out_local + 3),
                         (uint8_t *)inlen_local,_busy);
      if ((long)first < 0) goto LAB_00c4ecaa;
      inlen_local = (size_t)(first + inlen_local);
      lVar2._0_4_ = nv_out_local[7].token;
      lVar2._4_1_ = nv_out_local[7].flags;
      lVar2._5_3_ = *(undefined3 *)&nv_out_local[7].field_0x15;
      if (lVar2 != 0) goto LAB_00c4ec85;
      *(undefined1 *)&(nv_out_local[4].name)->mem_user_data = 0;
      (nv_out_local[6].value)->len = (long)nv_out_local[4].name - *(long *)&nv_out_local[3].token;
      *(undefined4 *)((long)&nv_out_local[9].value + 4) = 9;
      break;
    case 8:
      first = (uint8_t *)
              hd_inflate_read((nghttp2_hd_inflater *)nv_out_local,(nghttp2_buf *)(nv_out_local + 3),
                              (uint8_t *)inlen_local,_busy);
      if ((long)first < 0) goto LAB_00c4ecaa;
      inlen_local = (size_t)(first + inlen_local);
      lVar3._0_4_ = nv_out_local[7].token;
      lVar3._4_1_ = nv_out_local[7].flags;
      lVar3._5_3_ = *(undefined3 *)&nv_out_local[7].field_0x15;
      if (lVar3 != 0) goto LAB_00c4ec85;
      *(undefined1 *)&(nv_out_local[4].name)->mem_user_data = 0;
      (nv_out_local[6].value)->len = (long)nv_out_local[4].name - *(long *)&nv_out_local[3].token;
      *(undefined4 *)((long)&nv_out_local[9].value + 4) = 9;
      break;
    case 9:
      hd_inflate_set_huffman_encoded((nghttp2_hd_inflater *)nv_out_local,(uint8_t *)inlen_local);
      *(undefined4 *)((long)&nv_out_local[9].value + 4) = 10;
      nv_out_local[7].token = 0;
      nv_out_local[7].flags = '\0';
      *(undefined3 *)&nv_out_local[7].field_0x15 = 0;
      nv_out_local[9].name = (nghttp2_rcbuf *)0x0;
    case 10:
      mem._4_4_ = 0;
      first = (uint8_t *)
              hd_inflate_read_len((nghttp2_hd_inflater *)nv_out_local,(int *)((long)&mem + 4),
                                  (uint8_t *)inlen_local,_busy,7,0x10000);
      if ((long)first < 0) goto LAB_00c4ecaa;
      inlen_local = (size_t)(first + inlen_local);
      if (mem._4_4_ == 0) goto LAB_00c4ec85;
      if ((char)nv_out_local[9].token == '\0') {
        *(undefined4 *)((long)&nv_out_local[9].value + 4) = 0xc;
        iVar6 = nghttp2_rcbuf_new((nghttp2_rcbuf **)&nv_out_local[6].token,
                                  *(long *)&nv_out_local[7].token + 1,mem_00);
      }
      else {
        nghttp2_hd_huff_decode_context_init
                  ((nghttp2_hd_huff_decode_context *)&nv_out_local[2].token);
        *(undefined4 *)((long)&nv_out_local[9].value + 4) = 0xb;
        iVar6 = nghttp2_rcbuf_new((nghttp2_rcbuf **)&nv_out_local[6].token,
                                  *(long *)&nv_out_local[7].token * 2 + 1,mem_00);
      }
      first = (uint8_t *)(long)iVar6;
      if (first != (uint8_t *)0x0) goto LAB_00c4ecaa;
      nghttp2_buf_wrap_init
                ((nghttp2_buf *)&nv_out_local[4].token,
                 *(uint8_t **)(*(long *)&nv_out_local[6].token + 0x10),
                 *(size_t *)(*(long *)&nv_out_local[6].token + 0x18));
      mem._0_4_ = 1;
      break;
    case 0xb:
      first = (uint8_t *)
              hd_inflate_read_huff
                        ((nghttp2_hd_inflater *)nv_out_local,(nghttp2_buf *)&nv_out_local[4].token,
                         (uint8_t *)inlen_local,_busy);
      if (-1 < (long)first) {
        inlen_local = (size_t)(first + inlen_local);
        lVar4._0_4_ = nv_out_local[7].token;
        lVar4._4_1_ = nv_out_local[7].flags;
        lVar4._5_3_ = *(undefined3 *)&nv_out_local[7].field_0x15;
        if (lVar4 == 0) {
          **(undefined1 **)&nv_out_local[5].token = 0;
          *(long *)(*(long *)&nv_out_local[6].token + 0x18) =
               *(long *)&nv_out_local[5].token - (long)nv_out_local[5].value;
          if (*(int *)&nv_out_local[9].value == 2) {
            iVar6 = hd_inflate_commit_newname
                              ((nghttp2_hd_inflater *)nv_out_local,
                               (nghttp2_hd_nv *)inflate_flags_local);
          }
          else {
            iVar6 = hd_inflate_commit_indname
                              ((nghttp2_hd_inflater *)nv_out_local,
                               (nghttp2_hd_nv *)inflate_flags_local);
          }
          first = (uint8_t *)(long)iVar6;
          if (first == (uint8_t *)0x0) {
            *(undefined4 *)((long)&nv_out_local[9].value + 4) = 2;
            *(uint *)in_local = *(uint *)in_local | 2;
            return inlen_local - (long)last;
          }
        }
        else {
LAB_00c4ec85:
          if (rv._4_4_ == 0) {
            return inlen_local - (long)last;
          }
          first = (uint8_t *)0xfffffffffffffdf5;
        }
      }
LAB_00c4ecaa:
      *(undefined1 *)((long)&nv_out_local[2].value + 4) = 1;
      return (ssize_t)first;
    case 0xc:
      first = (uint8_t *)
              hd_inflate_read((nghttp2_hd_inflater *)nv_out_local,
                              (nghttp2_buf *)&nv_out_local[4].token,(uint8_t *)inlen_local,_busy);
      if ((long)first < 0) goto LAB_00c4ecaa;
      inlen_local = (size_t)(first + inlen_local);
      lVar5._0_4_ = nv_out_local[7].token;
      lVar5._4_1_ = nv_out_local[7].flags;
      lVar5._5_3_ = *(undefined3 *)&nv_out_local[7].field_0x15;
      if (lVar5 != 0) goto LAB_00c4ec85;
      **(undefined1 **)&nv_out_local[5].token = 0;
      *(long *)(*(long *)&nv_out_local[6].token + 0x18) =
           *(long *)&nv_out_local[5].token - (long)nv_out_local[5].value;
      if (*(int *)&nv_out_local[9].value == 2) {
        iVar6 = hd_inflate_commit_newname
                          ((nghttp2_hd_inflater *)nv_out_local,(nghttp2_hd_nv *)inflate_flags_local)
        ;
      }
      else {
        iVar6 = hd_inflate_commit_indname
                          ((nghttp2_hd_inflater *)nv_out_local,(nghttp2_hd_nv *)inflate_flags_local)
        ;
      }
      first = (uint8_t *)(long)iVar6;
      if (first == (uint8_t *)0x0) {
        *(undefined4 *)((long)&nv_out_local[9].value + 4) = 2;
        *(uint *)in_local = *(uint *)in_local | 2;
        return inlen_local - (long)last;
      }
      goto LAB_00c4ecaa;
    }
  } while( true );
}

Assistant:

ssize_t nghttp2_hd_inflate_hd_nv(nghttp2_hd_inflater *inflater,
                                 nghttp2_hd_nv *nv_out, int *inflate_flags,
                                 const uint8_t *in, size_t inlen,
                                 int in_final) {
  ssize_t rv = 0;
  const uint8_t *first = in;
  const uint8_t *last = in + inlen;
  int rfin = 0;
  int busy = 0;
  nghttp2_mem *mem;

  mem = inflater->ctx.mem;

  if (inflater->ctx.bad) {
    return NGHTTP2_ERR_HEADER_COMP;
  }

  DEBUGF("inflatehd: start state=%d\n", inflater->state);
  hd_inflate_keep_free(inflater);
  *inflate_flags = NGHTTP2_HD_INFLATE_NONE;
  for (; in != last || busy;) {
    busy = 0;
    switch (inflater->state) {
    case NGHTTP2_HD_STATE_EXPECT_TABLE_SIZE:
      if ((*in & 0xe0u) != 0x20u) {
        DEBUGF("inflatehd: header table size change was expected, but saw "
               "0x%02x as first byte",
               *in);
        rv = NGHTTP2_ERR_HEADER_COMP;
        goto fail;
      }
    /* fall through */
    case NGHTTP2_HD_STATE_INFLATE_START:
    case NGHTTP2_HD_STATE_OPCODE:
      if ((*in & 0xe0u) == 0x20u) {
        DEBUGF("inflatehd: header table size change\n");
        if (inflater->state == NGHTTP2_HD_STATE_OPCODE) {
          DEBUGF("inflatehd: header table size change must appear at the head "
                 "of header block\n");
          rv = NGHTTP2_ERR_HEADER_COMP;
          goto fail;
        }
        inflater->opcode = NGHTTP2_HD_OPCODE_INDEXED;
        inflater->state = NGHTTP2_HD_STATE_READ_TABLE_SIZE;
      } else if (*in & 0x80u) {
        DEBUGF("inflatehd: indexed repr\n");
        inflater->opcode = NGHTTP2_HD_OPCODE_INDEXED;
        inflater->state = NGHTTP2_HD_STATE_READ_INDEX;
      } else {
        if (*in == 0x40u || *in == 0 || *in == 0x10u) {
          DEBUGF("inflatehd: literal header repr - new name\n");
          inflater->opcode = NGHTTP2_HD_OPCODE_NEWNAME;
          inflater->state = NGHTTP2_HD_STATE_NEWNAME_CHECK_NAMELEN;
        } else {
          DEBUGF("inflatehd: literal header repr - indexed name\n");
          inflater->opcode = NGHTTP2_HD_OPCODE_INDNAME;
          inflater->state = NGHTTP2_HD_STATE_READ_INDEX;
        }
        inflater->index_required = (*in & 0x40) != 0;
        inflater->no_index = (*in & 0xf0u) == 0x10u;
        DEBUGF("inflatehd: indexing required=%d, no_index=%d\n",
               inflater->index_required, inflater->no_index);
        if (inflater->opcode == NGHTTP2_HD_OPCODE_NEWNAME) {
          ++in;
        }
      }
      inflater->left = 0;
      inflater->shift = 0;
      break;
    case NGHTTP2_HD_STATE_READ_TABLE_SIZE:
      rfin = 0;
      rv = hd_inflate_read_len(
          inflater, &rfin, in, last, 5,
          nghttp2_min(inflater->min_hd_table_bufsize_max,
                      inflater->settings_hd_table_bufsize_max));
      if (rv < 0) {
        goto fail;
      }
      in += rv;
      if (!rfin) {
        goto almost_ok;
      }
      DEBUGF("inflatehd: table_size=%zu\n", inflater->left);
      inflater->min_hd_table_bufsize_max = UINT32_MAX;
      inflater->ctx.hd_table_bufsize_max = inflater->left;
      hd_context_shrink_table_size(&inflater->ctx, NULL);
      inflater->state = NGHTTP2_HD_STATE_INFLATE_START;
      break;
    case NGHTTP2_HD_STATE_READ_INDEX: {
      size_t prefixlen;

      if (inflater->opcode == NGHTTP2_HD_OPCODE_INDEXED) {
        prefixlen = 7;
      } else if (inflater->index_required) {
        prefixlen = 6;
      } else {
        prefixlen = 4;
      }

      rfin = 0;
      rv = hd_inflate_read_len(inflater, &rfin, in, last, prefixlen,
                               get_max_index(&inflater->ctx));
      if (rv < 0) {
        goto fail;
      }

      in += rv;

      if (!rfin) {
        goto almost_ok;
      }

      if (inflater->left == 0) {
        rv = NGHTTP2_ERR_HEADER_COMP;
        goto fail;
      }

      DEBUGF("inflatehd: index=%zu\n", inflater->left);
      if (inflater->opcode == NGHTTP2_HD_OPCODE_INDEXED) {
        inflater->index = inflater->left;
        --inflater->index;

        hd_inflate_commit_indexed(inflater, nv_out);

        inflater->state = NGHTTP2_HD_STATE_OPCODE;
        *inflate_flags |= NGHTTP2_HD_INFLATE_EMIT;
        return (ssize_t)(in - first);
      } else {
        inflater->index = inflater->left;
        --inflater->index;

        inflater->state = NGHTTP2_HD_STATE_CHECK_VALUELEN;
      }
      break;
    }
    case NGHTTP2_HD_STATE_NEWNAME_CHECK_NAMELEN:
      hd_inflate_set_huffman_encoded(inflater, in);
      inflater->state = NGHTTP2_HD_STATE_NEWNAME_READ_NAMELEN;
      inflater->left = 0;
      inflater->shift = 0;
      DEBUGF("inflatehd: huffman encoded=%d\n", inflater->huffman_encoded != 0);
    /* Fall through */
    case NGHTTP2_HD_STATE_NEWNAME_READ_NAMELEN:
      rfin = 0;
      rv = hd_inflate_read_len(inflater, &rfin, in, last, 7, NGHTTP2_HD_MAX_NV);
      if (rv < 0) {
        goto fail;
      }
      in += rv;
      if (!rfin) {
        DEBUGF("inflatehd: integer not fully decoded. current=%zu\n",
               inflater->left);

        goto almost_ok;
      }

      if (inflater->huffman_encoded) {
        nghttp2_hd_huff_decode_context_init(&inflater->huff_decode_ctx);

        inflater->state = NGHTTP2_HD_STATE_NEWNAME_READ_NAMEHUFF;

        rv = nghttp2_rcbuf_new(&inflater->namercbuf, inflater->left * 2 + 1,
                               mem);
      } else {
        inflater->state = NGHTTP2_HD_STATE_NEWNAME_READ_NAME;
        rv = nghttp2_rcbuf_new(&inflater->namercbuf, inflater->left + 1, mem);
      }

      if (rv != 0) {
        goto fail;
      }

      nghttp2_buf_wrap_init(&inflater->namebuf, inflater->namercbuf->base,
                            inflater->namercbuf->len);

      break;
    case NGHTTP2_HD_STATE_NEWNAME_READ_NAMEHUFF:
      rv = hd_inflate_read_huff(inflater, &inflater->namebuf, in, last);
      if (rv < 0) {
        goto fail;
      }

      in += rv;

      DEBUGF("inflatehd: %zd bytes read\n", rv);

      if (inflater->left) {
        DEBUGF("inflatehd: still %zu bytes to go\n", inflater->left);

        goto almost_ok;
      }

      *inflater->namebuf.last = '\0';
      inflater->namercbuf->len = nghttp2_buf_len(&inflater->namebuf);

      inflater->state = NGHTTP2_HD_STATE_CHECK_VALUELEN;

      break;
    case NGHTTP2_HD_STATE_NEWNAME_READ_NAME:
      rv = hd_inflate_read(inflater, &inflater->namebuf, in, last);
      if (rv < 0) {
        goto fail;
      }

      in += rv;

      DEBUGF("inflatehd: %zd bytes read\n", rv);
      if (inflater->left) {
        DEBUGF("inflatehd: still %zu bytes to go\n", inflater->left);

        goto almost_ok;
      }

      *inflater->namebuf.last = '\0';
      inflater->namercbuf->len = nghttp2_buf_len(&inflater->namebuf);

      inflater->state = NGHTTP2_HD_STATE_CHECK_VALUELEN;

      break;
    case NGHTTP2_HD_STATE_CHECK_VALUELEN:
      hd_inflate_set_huffman_encoded(inflater, in);
      inflater->state = NGHTTP2_HD_STATE_READ_VALUELEN;
      inflater->left = 0;
      inflater->shift = 0;
      DEBUGF("inflatehd: huffman encoded=%d\n", inflater->huffman_encoded != 0);
    /* Fall through */
    case NGHTTP2_HD_STATE_READ_VALUELEN:
      rfin = 0;
      rv = hd_inflate_read_len(inflater, &rfin, in, last, 7, NGHTTP2_HD_MAX_NV);
      if (rv < 0) {
        goto fail;
      }

      in += rv;

      if (!rfin) {
        goto almost_ok;
      }

      DEBUGF("inflatehd: valuelen=%zu\n", inflater->left);

      if (inflater->huffman_encoded) {
        nghttp2_hd_huff_decode_context_init(&inflater->huff_decode_ctx);

        inflater->state = NGHTTP2_HD_STATE_READ_VALUEHUFF;

        rv = nghttp2_rcbuf_new(&inflater->valuercbuf, inflater->left * 2 + 1,
                               mem);
      } else {
        inflater->state = NGHTTP2_HD_STATE_READ_VALUE;

        rv = nghttp2_rcbuf_new(&inflater->valuercbuf, inflater->left + 1, mem);
      }

      if (rv != 0) {
        goto fail;
      }

      nghttp2_buf_wrap_init(&inflater->valuebuf, inflater->valuercbuf->base,
                            inflater->valuercbuf->len);

      busy = 1;

      break;
    case NGHTTP2_HD_STATE_READ_VALUEHUFF:
      rv = hd_inflate_read_huff(inflater, &inflater->valuebuf, in, last);
      if (rv < 0) {
        goto fail;
      }

      in += rv;

      DEBUGF("inflatehd: %zd bytes read\n", rv);

      if (inflater->left) {
        DEBUGF("inflatehd: still %zu bytes to go\n", inflater->left);

        goto almost_ok;
      }

      *inflater->valuebuf.last = '\0';
      inflater->valuercbuf->len = nghttp2_buf_len(&inflater->valuebuf);

      if (inflater->opcode == NGHTTP2_HD_OPCODE_NEWNAME) {
        rv = hd_inflate_commit_newname(inflater, nv_out);
      } else {
        rv = hd_inflate_commit_indname(inflater, nv_out);
      }

      if (rv != 0) {
        goto fail;
      }

      inflater->state = NGHTTP2_HD_STATE_OPCODE;
      *inflate_flags |= NGHTTP2_HD_INFLATE_EMIT;

      return (ssize_t)(in - first);
    case NGHTTP2_HD_STATE_READ_VALUE:
      rv = hd_inflate_read(inflater, &inflater->valuebuf, in, last);
      if (rv < 0) {
        DEBUGF("inflatehd: value read failure %zd: %s\n", rv,
               nghttp2_strerror((int)rv));
        goto fail;
      }

      in += rv;

      DEBUGF("inflatehd: %zd bytes read\n", rv);

      if (inflater->left) {
        DEBUGF("inflatehd: still %zu bytes to go\n", inflater->left);
        goto almost_ok;
      }

      *inflater->valuebuf.last = '\0';
      inflater->valuercbuf->len = nghttp2_buf_len(&inflater->valuebuf);

      if (inflater->opcode == NGHTTP2_HD_OPCODE_NEWNAME) {
        rv = hd_inflate_commit_newname(inflater, nv_out);
      } else {
        rv = hd_inflate_commit_indname(inflater, nv_out);
      }

      if (rv != 0) {
        goto fail;
      }

      inflater->state = NGHTTP2_HD_STATE_OPCODE;
      *inflate_flags |= NGHTTP2_HD_INFLATE_EMIT;

      return (ssize_t)(in - first);
    }
  }

  assert(in == last);

  DEBUGF("inflatehd: all input bytes were processed\n");

  if (in_final) {
    DEBUGF("inflatehd: in_final set\n");

    if (inflater->state != NGHTTP2_HD_STATE_OPCODE &&
        inflater->state != NGHTTP2_HD_STATE_INFLATE_START) {
      DEBUGF("inflatehd: unacceptable state=%d\n", inflater->state);
      rv = NGHTTP2_ERR_HEADER_COMP;

      goto fail;
    }
    *inflate_flags |= NGHTTP2_HD_INFLATE_FINAL;
  }
  return (ssize_t)(in - first);

almost_ok:
  if (in_final) {
    DEBUGF("inflatehd: input ended prematurely\n");

    rv = NGHTTP2_ERR_HEADER_COMP;

    goto fail;
  }
  return (ssize_t)(in - first);

fail:
  DEBUGF("inflatehd: error return %zd\n", rv);

  inflater->ctx.bad = 1;
  return rv;
}